

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import-utils.h
# Opt level: O2

Global * __thiscall wasm::ImportInfo::getImportedGlobal(ImportInfo *this,Name module,Name base)

{
  Global *pGVar1;
  pointer ppGVar2;
  
  ppGVar2 = (this->importedGlobals).
            super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppGVar2 ==
        (this->importedGlobals).super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return (Global *)0x0;
    }
    pGVar1 = *ppGVar2;
    if (((pGVar1->super_Importable).module.super_IString.str._M_str ==
         module.super_IString.str._M_str) &&
       ((pGVar1->super_Importable).base.super_IString.str._M_str == base.super_IString.str._M_str))
    break;
    ppGVar2 = ppGVar2 + 1;
  }
  return pGVar1;
}

Assistant:

Global* getImportedGlobal(Name module, Name base) {
    for (auto* import : importedGlobals) {
      if (import->module == module && import->base == base) {
        return import;
      }
    }
    return nullptr;
  }